

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::p_1(disp *this,int x)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  to_string<int>(&local_50,x);
  std::operator+(&local_30,"p_1:",&local_50);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void p_1(int x) { v_="p_1:" + to_string(x); }